

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O0

void __thiscall
ELFIO::section_impl<ELFIO::Elf64_Shdr>::append_data
          (section_impl<ELFIO::Elf64_Shdr> *this,char *raw_data,Elf_Word size)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  uint in_EDX;
  long *in_RDI;
  bad_alloc *anon_var_0;
  char *new_data;
  char *in_stack_ffffffffffffff70;
  char *__result;
  char *in_stack_ffffffffffffff78;
  char *__last;
  char *in_stack_ffffffffffffff80;
  char *__first;
  
  iVar1 = (**(code **)(*in_RDI + 0x28))();
  if (iVar1 != 8) {
    lVar2 = (**(code **)(*in_RDI + 0x98))();
    if (lVar2 + (ulong)in_EDX < (ulong)*(uint *)(in_RDI + 0x10)) {
      (**(code **)(*in_RDI + 0x98))();
      std::copy<char_const*,char*>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    }
    else {
      *(uint *)(in_RDI + 0x10) = ((int)in_RDI[0x10] + in_EDX) * 2;
      pcVar3 = (char *)operator_new__((ulong)*(uint *)(in_RDI + 0x10));
      if (pcVar3 != (char *)0x0) {
        __last = (char *)in_RDI[0xf];
        __result = (char *)in_RDI[0xf];
        (**(code **)(*in_RDI + 0x98))();
        std::copy<char*,char*>(in_stack_ffffffffffffff80,__last,__result);
        __first = pcVar3;
        (**(code **)(*in_RDI + 0x98))();
        std::copy<char_const*,char*>(__first,__last,__result);
        if ((void *)in_RDI[0xf] != (void *)0x0) {
          operator_delete__((void *)in_RDI[0xf]);
        }
        in_RDI[0xf] = (long)pcVar3;
      }
    }
    lVar2 = (**(code **)(*in_RDI + 0x98))();
    (**(code **)(*in_RDI + 0xa0))(in_RDI,lVar2 + (ulong)in_EDX);
  }
  return;
}

Assistant:

void
    append_data( const char* raw_data, Elf_Word size )
    {
        if ( get_type() != SHT_NOBITS ) {
            if ( get_size() + size < data_size ) {
                std::copy( raw_data, raw_data + size, data + get_size() );
            }
            else {
                data_size = 2*( data_size + size);
                char* new_data;
                try {
                    new_data = new char[data_size];
                } catch (const std::bad_alloc&) {
                    new_data = 0;
                    size     = 0;
                }
                if ( 0 != new_data ) {
                    std::copy( data, data + get_size(), new_data );
                    std::copy( raw_data, raw_data + size, new_data + get_size() );
                    delete [] data;
                    data = new_data;
                }
            }
            set_size( get_size() + size );
        }
    }